

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::traverse_all_reachable_opcodes
          (Compiler *this,SPIRFunction *func,OpcodeHandler *handler)

{
  TypedID<(diligent_spirv_cross::Types)6> *pTVar1;
  long lVar2;
  bool bVar3;
  SPIRBlock *block;
  long lVar4;
  long lVar5;
  
  pTVar1 = (func->blocks).
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.ptr;
  lVar5 = (func->blocks).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.
          buffer_size << 2;
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar5 == lVar4) break;
    block = get<diligent_spirv_cross::SPIRBlock>(this,*(uint32_t *)((long)&pTVar1->id + lVar4));
    bVar3 = traverse_all_reachable_opcodes(this,block,handler);
    lVar2 = lVar4 + 4;
  } while (bVar3);
  return lVar5 == lVar4;
}

Assistant:

bool Compiler::traverse_all_reachable_opcodes(const SPIRFunction &func, OpcodeHandler &handler) const
{
	for (auto block : func.blocks)
		if (!traverse_all_reachable_opcodes(get<SPIRBlock>(block), handler))
			return false;

	return true;
}